

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::BayesianProbitRegressor::_InternalSerialize
          (BayesianProbitRegressor *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  BayesianProbitRegressor_Gaussian *this_00;
  long lVar2;
  ulong uVar3;
  void *data;
  bool bVar4;
  Type *this_01;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  int index;
  uint8_t *puVar8;
  size_t __n;
  
  puVar8 = target;
  if (this->numberoffeatures_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->numberoffeatures_;
    *target = '\b';
    target[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar8 = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      target[2] = (uint8_t)(uVar6 >> 7);
      puVar8 = target + 3;
      if (0x3fff < uVar6) {
        uVar7 = (uint)target[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar8[-1] = (byte)uVar7 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar8 = (uint8_t)uVar7;
          puVar8 = puVar8 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar4);
      }
    }
  }
  if ((this != (BayesianProbitRegressor *)_BayesianProbitRegressor_default_instance_) &&
     (this->bias_ != (BayesianProbitRegressor_Gaussian *)0x0)) {
    if (stream->end_ <= puVar8) {
      puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar8);
    }
    this_00 = this->bias_;
    *puVar8 = '\x12';
    uVar6 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar8[1] = (uint8_t)uVar6;
    if (uVar6 < 0x80) {
      puVar8 = puVar8 + 2;
    }
    else {
      puVar8 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar6,puVar8 + 1);
    }
    puVar8 = BayesianProbitRegressor_Gaussian::_InternalSerialize(this_00,puVar8,stream);
  }
  iVar1 = (this->features_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (stream->end_ <= puVar8) {
        puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar8);
      }
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
                          (&(this->features_).super_RepeatedPtrFieldBase,index);
      *puVar8 = '\x1a';
      uVar6 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar8[1] = (uint8_t)uVar6;
      if (uVar6 < 0x80) {
        puVar8 = puVar8 + 2;
      }
      else {
        puVar8 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar6,puVar8 + 1);
      }
      puVar8 = BayesianProbitRegressor_FeatureWeight::_InternalSerialize(this_01,puVar8,stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  puVar5 = (undefined8 *)
           ((ulong)(this->regressioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar5[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,10,
                        (string *)
                        ((ulong)(this->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),puVar8);
  }
  puVar5 = (undefined8 *)
           ((ulong)(this->optimisminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar5[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xb,
                        (string *)
                        ((ulong)(this->optimisminputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),puVar8);
  }
  puVar5 = (undefined8 *)
           ((ulong)(this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar5[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xc,
                        (string *)
                        ((ulong)(this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),puVar8);
  }
  puVar5 = (undefined8 *)
           ((ulong)(this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
           );
  lVar2 = puVar5[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xd,
                        (string *)
                        ((ulong)(this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),puVar8);
  }
  puVar5 = (undefined8 *)
           ((ulong)(this->meanoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar5[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x14,
                        (string *)
                        ((ulong)(this->meanoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
                        ),puVar8);
  }
  puVar5 = (undefined8 *)
           ((ulong)(this->varianceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar5[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x15,
                        (string *)
                        ((ulong)(this->varianceoutputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),puVar8);
  }
  puVar5 = (undefined8 *)
           ((ulong)(this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  lVar2 = puVar5[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"
              );
    puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x16,
                        (string *)
                        ((ulong)(this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),puVar8);
  }
  puVar5 = (undefined8 *)
           ((ulong)(this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  lVar2 = puVar5[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x17,
                        (string *)
                        ((ulong)(this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),puVar8);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    data = *(void **)((uVar3 & 0xfffffffffffffffc) + 8);
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 1) == 0) {
      puVar5 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar5 = (undefined8 *)((uVar3 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar5[1];
    if ((long)stream->end_ - (long)puVar8 < (long)__n) {
      puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar5[1],puVar8);
      return puVar8;
    }
    memcpy(puVar8,data,__n);
    puVar8 = puVar8 + __n;
  }
  return puVar8;
}

Assistant:

uint8_t* BayesianProbitRegressor::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BayesianProbitRegressor)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 numberOfFeatures = 1;
  if (this->_internal_numberoffeatures() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt32ToArray(1, this->_internal_numberoffeatures(), target);
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->_internal_has_bias()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::bias(this), target, stream);
  }

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_features_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_features(i), target, stream);
  }

  // string regressionInputFeatureName = 10;
  if (!this->_internal_regressioninputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_regressioninputfeaturename().data(), static_cast<int>(this->_internal_regressioninputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        10, this->_internal_regressioninputfeaturename(), target);
  }

  // string optimismInputFeatureName = 11;
  if (!this->_internal_optimisminputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_optimisminputfeaturename().data(), static_cast<int>(this->_internal_optimisminputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        11, this->_internal_optimisminputfeaturename(), target);
  }

  // string samplingScaleInputFeatureName = 12;
  if (!this->_internal_samplingscaleinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_samplingscaleinputfeaturename().data(), static_cast<int>(this->_internal_samplingscaleinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_samplingscaleinputfeaturename(), target);
  }

  // string samplingTruncationInputFeatureName = 13;
  if (!this->_internal_samplingtruncationinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_samplingtruncationinputfeaturename().data(), static_cast<int>(this->_internal_samplingtruncationinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_samplingtruncationinputfeaturename(), target);
  }

  // string meanOutputFeatureName = 20;
  if (!this->_internal_meanoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_meanoutputfeaturename().data(), static_cast<int>(this->_internal_meanoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        20, this->_internal_meanoutputfeaturename(), target);
  }

  // string varianceOutputFeatureName = 21;
  if (!this->_internal_varianceoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_varianceoutputfeaturename().data(), static_cast<int>(this->_internal_varianceoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        21, this->_internal_varianceoutputfeaturename(), target);
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (!this->_internal_pessimisticprobabilityoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_pessimisticprobabilityoutputfeaturename().data(), static_cast<int>(this->_internal_pessimisticprobabilityoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        22, this->_internal_pessimisticprobabilityoutputfeaturename(), target);
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (!this->_internal_sampledprobabilityoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_sampledprobabilityoutputfeaturename().data(), static_cast<int>(this->_internal_sampledprobabilityoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        23, this->_internal_sampledprobabilityoutputfeaturename(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BayesianProbitRegressor)
  return target;
}